

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_adopt_socket_vhost(lws_vhost *vh,lws_sockfd_type accept_fd)

{
  lws *plVar1;
  lws_adopt_desc_t local_28;
  
  local_28.vh_prot_name = (char *)0x0;
  local_28.parent = (lws *)0x0;
  local_28.opaque = (void *)0x0;
  local_28.fd.sockfd = accept_fd;
  local_28.type = LWS_ADOPT_ALLOW_SSL|LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP;
  local_28.vh = vh;
  plVar1 = lws_adopt_descriptor_vhost_via_info(&local_28);
  return plVar1;
}

Assistant:

struct lws *
lws_adopt_socket_vhost(struct lws_vhost *vh, lws_sockfd_type accept_fd)
{
	lws_sock_file_fd_type fd;

	fd.sockfd = accept_fd;
	return lws_adopt_descriptor_vhost(vh, LWS_ADOPT_SOCKET |
			LWS_ADOPT_HTTP | LWS_ADOPT_ALLOW_SSL, fd, NULL, NULL);
}